

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator+(unsigned_short lhs,
         SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  int iVar1;
  undefined2 in_register_0000003a;
  
  iVar1 = (int)rhs.m_int + CONCAT22(in_register_0000003a,lhs);
  if (iVar1 < 0x8000) {
    return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)(short)iVar1;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //16-bit or less unsigned addition
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }